

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamUtils.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
fw::loadStream(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
              istream *stream)

{
  ulong uVar1;
  logic_error *this;
  size_type __n;
  uchar *puVar2;
  allocator<unsigned_char> local_3a;
  undefined1 local_39;
  fpos local_38 [8];
  pos_type length;
  istream *stream_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) != 0) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Stream is in fail state.");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::istream::seekg((long)stream,_S_beg);
  _local_38 = std::istream::tellg();
  std::istream::seekg((long)stream,_S_beg);
  local_39 = 0;
  __n = std::fpos::operator_cast_to_long(local_38);
  std::allocator<unsigned_char>::allocator(&local_3a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,&local_3a);
  std::allocator<unsigned_char>::~allocator(&local_3a);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(__return_storage_ptr__);
  std::fpos::operator_cast_to_long(local_38);
  std::istream::read((char *)stream,(long)puVar2);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> loadStream(std::istream& stream)
{
    if (stream.fail())
    {
        throw std::logic_error("Stream is in fail state.");
    }

    stream.seekg(0, stream.end);
    auto length = stream.tellg();
    stream.seekg(0, stream.beg);

    std::vector<unsigned char> buffer(length);
    stream.read(reinterpret_cast<char*>(buffer.data()), length);

    return buffer;
}